

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastCmEqLikely(Lowerer *this,Instr *instr,bool *pNeedHelper,bool isInHelper)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  OpCode OVar5;
  LibraryValue valueType;
  LibraryValue valueType_00;
  undefined4 *puVar6;
  Opnd *pOVar7;
  Opnd *pOVar8;
  LabelInstr *pLVar9;
  LabelInstr *branchTarget;
  LabelInstr *labelHelper_00;
  BranchInstr *pBVar10;
  LabelInstr *cmEqual;
  LibraryValue failureValueType;
  LibraryValue successValueType;
  LabelInstr *labelHelper;
  LabelInstr *labelDone;
  LabelInstr *labelEqualLikely;
  Opnd *src2;
  Opnd *src1;
  bool isStrict;
  bool isNegOp;
  bool isInHelper_local;
  bool *pNeedHelper_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  *pNeedHelper = false;
  if ((((instr->m_opcode != CmSrEq_A) && (instr->m_opcode != CmSrNeq_A)) &&
      (instr->m_opcode != CmEq_A)) && (instr->m_opcode != CmNeq_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5e60,
                       "(instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar4 = false;
  bVar2 = false;
  OVar5 = instr->m_opcode;
  if (OVar5 != CmNeq_A) {
    if (OVar5 == CmSrEq_A) {
      bVar2 = true;
      goto LAB_007cdb90;
    }
    if (OVar5 != CmSrNeq_A) goto LAB_007cdb90;
    bVar2 = true;
  }
  bVar4 = true;
LAB_007cdb90:
  pOVar7 = IR::Instr::GetSrc1(instr);
  pOVar8 = IR::Instr::GetSrc2(instr);
  pLVar9 = IR::LabelInstr::New(Label,this->m_func,isInHelper);
  branchTarget = IR::LabelInstr::New(Label,this->m_func,isInHelper);
  labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,true);
  bVar3 = GenerateFastBooleanAndObjectEqLikely
                    (this,instr,pOVar7,pOVar8,labelHelper_00,pLVar9,pNeedHelper,isInHelper);
  if (bVar3) {
    IR::Instr::InsertBefore(instr,&pLVar9->super_Instr);
    valueType = ValueFalse;
    if (!bVar4) {
      valueType = ValueTrue;
    }
    valueType_00 = ValueTrue;
    if (!bVar4) {
      valueType_00 = ValueFalse;
    }
    bVar4 = IR::Opnd::IsEqual(pOVar7,pOVar8);
    if (bVar4) {
      pOVar7 = IR::Instr::GetDst(instr);
      pOVar8 = LoadLibraryValueOpnd(this,instr,valueType);
      InsertMove(pOVar7,pOVar8,instr,true);
      pBVar10 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
      IR::Instr::InsertBefore(instr,&pBVar10->super_Instr);
    }
    else {
      pLVar9 = IR::LabelInstr::New(Label,this->m_func,isInHelper);
      OVar5 = BrEq_A;
      if (bVar2) {
        OVar5 = BrSrEq_A;
      }
      InsertCompareBranch(this,pOVar7,pOVar8,OVar5,pLVar9,instr,false);
      pOVar7 = IR::Instr::GetDst(instr);
      pOVar8 = LoadLibraryValueOpnd(this,instr,valueType_00);
      InsertMove(pOVar7,pOVar8,instr,true);
      pBVar10 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
      IR::Instr::InsertBefore(instr,&pBVar10->super_Instr);
      IR::Instr::InsertBefore(instr,&pLVar9->super_Instr);
      pOVar7 = IR::Instr::GetDst(instr);
      pOVar8 = LoadLibraryValueOpnd(this,instr,valueType);
      InsertMove(pOVar7,pOVar8,instr,true);
      pBVar10 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
      IR::Instr::InsertBefore(instr,&pBVar10->super_Instr);
    }
    IR::Instr::InsertBefore(instr,&labelHelper_00->super_Instr);
    IR::Instr::InsertAfter(instr,&branchTarget->super_Instr);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Lowerer::GenerateFastCmEqLikely(IR::Instr * instr, bool *pNeedHelper, bool isInHelper)
{
    *pNeedHelper = false;

    Assert(instr->m_opcode == Js::OpCode::CmSrEq_A ||
        instr->m_opcode == Js::OpCode::CmSrNeq_A   ||
        instr->m_opcode == Js::OpCode::CmEq_A      ||
        instr->m_opcode == Js::OpCode::CmNeq_A);

    bool isNegOp = false;
    bool isStrict = false;
    switch (instr->m_opcode)
    {
    case Js::OpCode::CmSrEq_A:
        isStrict = true;
        break;

    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
    case Js::OpCode::CmNeq_A:
        isNegOp = true;
        break;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    IR::LabelInstr *labelEqualLikely = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!this->GenerateFastBooleanAndObjectEqLikely(instr, src1, src2, labelHelper, labelEqualLikely, pNeedHelper, isInHelper))
    {
        return false;
    }

    instr->InsertBefore(labelEqualLikely);

    // $labelEqualLikely
    //
    // Will only come here for
    //   if src2 is dynamic object(matches Js::DynamicObject::`vtable'), for non strict cm both src1 and src2 should be dynamic object
    //   or if src2 is builtin recyclableobject(typeId > TypeIds_LastStaticType && typeId <= TypeIds_LastBuiltinDynamicObject)
    //   or if CustomExternalType with no operations usage flags
    //
    //  src1->IsEqual(src2)
    //      MOV DST SUCCESS
    //      JMP $DONE
    //  CMP src1, src2
    //      MOV DST SUCCESS
    //      JEQ $DONE
    //      MOV DST FAILURE
    //      JMP $DONE

    LibraryValue successValueType = !isNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
    LibraryValue failureValueType = !isNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;

    if (src1->IsEqual(src2))
    {
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, successValueType), instr);
        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));
    }
    else
    {
        IR::LabelInstr *cmEqual = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
        this->InsertCompareBranch(src1, src2, isStrict ? Js::OpCode::BrSrEq_A : Js::OpCode::BrEq_A, cmEqual, instr);
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, failureValueType), instr);

        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));

        instr->InsertBefore(cmEqual);
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, successValueType), instr);

        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));
    }

    instr->InsertBefore(labelHelper);
    instr->InsertAfter(labelDone);

    return true;
}